

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O1

void __thiscall uv::Loop::run(Loop *this)

{
  uint uVar1;
  int iVar2;
  Exception *this_00;
  undefined **ppuVar3;
  uint uVar4;
  error_code ec;
  
  ppuVar3 = (undefined **)std::_V2::system_category();
  uVar1 = uv_run(this->loop_ptr_,0);
  uVar4 = 0;
  if (uVar1 != 0) {
    if (getCategory()::instance == '\0') {
      iVar2 = __cxa_guard_acquire(&getCategory()::instance);
      if (iVar2 != 0) {
        __cxa_atexit(std::_V2::error_category::~error_category,&getCategory()::instance,
                     &__dso_handle);
        __cxa_guard_release(&getCategory()::instance);
      }
    }
    ppuVar3 = &getCategory()::instance;
    uVar4 = uVar1;
  }
  if (uVar4 == 0) {
    return;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x38);
  ec._4_4_ = 0;
  ec._M_value = uVar4;
  ec._M_cat = (error_category *)ppuVar3;
  Exception::Exception(this_00,ec);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void Loop::run()
	{
		std::error_code ec;

		run(ec);
		if (ec) {
			throw uv::Exception(ec);
		}
	}